

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDM.cpp
# Opt level: O2

int PurgeDataAndWaitNsMDM(MDM *pMDM,BOOL *pbError,int n)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = PurgeDataMDM(pMDM);
  if (iVar1 == 0) {
    iVar1 = WaitNsMDM(n);
    uVar2 = (uint)(iVar1 != 0);
  }
  else {
    *pbError = 1;
    uVar2 = 1;
  }
  return uVar2;
}

Assistant:

inline int PurgeDataAndWaitNsMDM(MDM* pMDM, BOOL* pbError, int n)
{
	if (PurgeDataMDM(pMDM) != EXIT_SUCCESS)
	{
		*pbError = TRUE;
		return EXIT_FAILURE;
	}
	if (WaitNsMDM(n) != EXIT_SUCCESS) return EXIT_FAILURE;

	return EXIT_SUCCESS;
}